

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_has_no_value_exception::option_has_no_value_exception
          (option_has_no_value_exception *this,string *option)

{
  bool bVar1;
  allocator<char> local_b0;
  byte local_af;
  byte local_ae;
  byte local_ad;
  byte local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *option_local;
  option_has_no_value_exception *this_local;
  
  local_18 = option;
  option_local = (string *)this;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (option);
  local_99 = 0;
  local_ad = 0;
  local_ae = 0;
  local_af = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Option has no value",&local_b0);
  }
  else {
    std::operator+(&local_98,"Option ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::LQUOTE_abi_cxx11_);
    local_99 = 1;
    std::operator+(&local_78,&local_98,local_18);
    local_ad = 1;
    std::operator+(&local_58,&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::RQUOTE_abi_cxx11_);
    local_ae = 1;
    std::operator+(&local_38,&local_58," has no value");
    local_af = 1;
  }
  OptionException::OptionException(&this->super_OptionException,&local_38);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_b0);
  }
  if ((local_af & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_ae & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_ad & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  *(undefined ***)&this->super_OptionException = &PTR__option_has_no_value_exception_001a3d28;
  return;
}

Assistant:

explicit option_has_no_value_exception(const std::string& option)
    : OptionException(
        !option.empty() ?
        ("Option " + LQUOTE + option + RQUOTE + " has no value") :
        "Option has no value")
    {
    }